

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::COMBICState::COMBICState
          (COMBICState *this,KUINT8 Index,KUINT32 TimeSinceCreation,EntityType *MunitionSource,
          KUINT32 NumberOfSources,KUINT16 GeometryIndex,KUINT32 SourceType,KFLOAT32 BarrageRate,
          KFLOAT32 BarrageDuration,KFLOAT32 BarrageCrosswindLength,KFLOAT32 BarrageDownwindLength,
          EulerAngles *DetonationVelocity)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KFLOAT32 KVar7;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__COMBICState_00226870;
  this->m_ui32TSC = TimeSinceCreation;
  (this->m_MunSrc).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00217c70
  ;
  KVar1 = MunitionSource->m_ui8Domain;
  KVar2 = MunitionSource->m_ui16Country;
  KVar3 = MunitionSource->m_ui8Category;
  KVar4 = MunitionSource->m_ui8SubCategory;
  KVar5 = MunitionSource->m_ui8Specific;
  KVar6 = MunitionSource->m_ui8Extra;
  (this->m_MunSrc).m_ui8EntityKind = MunitionSource->m_ui8EntityKind;
  (this->m_MunSrc).m_ui8Domain = KVar1;
  (this->m_MunSrc).m_ui16Country = KVar2;
  (this->m_MunSrc).m_ui8Category = KVar3;
  (this->m_MunSrc).m_ui8SubCategory = KVar4;
  (this->m_MunSrc).m_ui8Specific = KVar5;
  (this->m_MunSrc).m_ui8Extra = KVar6;
  this->m_ui32NumSrcs = NumberOfSources;
  this->m_ui16GeometryIndex = GeometryIndex;
  this->m_ui16Padding = 0;
  this->m_ui32SrcType = SourceType;
  this->m_f32BarrageRate = BarrageRate;
  this->m_f32BarrageDuration = BarrageDuration;
  this->m_f32BarrageCrosswindLength = BarrageCrosswindLength;
  this->m_f32BarrageDownwindLength = BarrageDownwindLength;
  (this->m_DetVel).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00217cc8;
  KVar7 = DetonationVelocity->m_f32Theta;
  (this->m_DetVel).m_f32Psi = DetonationVelocity->m_f32Psi;
  (this->m_DetVel).m_f32Theta = KVar7;
  (this->m_DetVel).m_f32Phi = DetonationVelocity->m_f32Phi;
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x100;
  (this->super_EnvironmentRecord).m_ui16Length = 0x200;
  return;
}

Assistant:

COMBICState::COMBICState( KUINT8 Index, KUINT32 TimeSinceCreation, const EntityType & MunitionSource,
                          KUINT32 NumberOfSources, KUINT16 GeometryIndex, KUINT32 SourceType,
                          KFLOAT32 BarrageRate, KFLOAT32 BarrageDuration, KFLOAT32 BarrageCrosswindLength,
                          KFLOAT32 BarrageDownwindLength, const EulerAngles & DetonationVelocity ) :
    m_ui32TSC( TimeSinceCreation ),
    m_MunSrc( MunitionSource ),
    m_ui32NumSrcs( NumberOfSources ),
    m_ui16GeometryIndex( GeometryIndex ),
    m_ui16Padding( 0 ),
    m_ui32SrcType( SourceType ),
    m_f32BarrageRate( BarrageRate ),
    m_f32BarrageDuration( BarrageDuration ),
    m_f32BarrageCrosswindLength( BarrageCrosswindLength ),
    m_f32BarrageDownwindLength( BarrageDownwindLength ),
    m_DetVel( DetonationVelocity ),
    m_ui32Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = COMBICStateType;
    m_ui16Length = COMBIC_STATE_SIZE * 8;
}